

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

bool P_LerpCalculate(AActor *pmo,PredictPos *from,PredictPos *to,PredictPos *result,float scale)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  DVector2 v;
  double local_28;
  double dStack_20;
  
  dVar4 = (from->pos).Y;
  dVar6 = (to->pos).Y;
  dVar3 = (double)scale;
  dVar6 = ((dVar6 - dVar4) * dVar3 + dVar4) - dVar6;
  dVar4 = (to->pos).X;
  dVar5 = (to->pos).Z;
  dVar1 = (from->pos).X;
  dVar2 = (from->pos).Z;
  dVar4 = (dVar3 * (dVar4 - dVar1) + dVar1) - dVar4;
  dVar5 = (dVar3 * (dVar5 - dVar2) + dVar2) - dVar5;
  P_GetOffsetPosition((pmo->__Pos).X,(pmo->__Pos).Y,dVar4,dVar6);
  (result->pos).Z = dVar5 + (pmo->__Pos).Z;
  (result->pos).X = local_28;
  (result->pos).Y = dStack_20;
  return scale <= 1.0 &&
         (double)cl_predict_lerpthreshold.Value < dVar5 * dVar5 + dVar6 * dVar6 + dVar4 * dVar4;
}

Assistant:

bool P_LerpCalculate(AActor *pmo, PredictPos from, PredictPos to, PredictPos &result, float scale)
{
	//DVector2 pfrom = Displacements.getOffset(from.portalgroup, to.portalgroup);
	DVector3 vecFrom = from.pos;
	DVector3 vecTo = to.pos;
	DVector3 vecResult;
	vecResult = vecTo - vecFrom;
	vecResult *= scale;
	vecResult = vecResult + vecFrom;
	DVector3 delta = vecResult - vecTo;

	result.pos = pmo->Vec3Offset(vecResult - to.pos);
	//result.portalgroup = P_PointInSector(result.pos.x, result.pos.y)->PortalGroup;

	// As a fail safe, assume extrapolation is the threshold.
	return (delta.LengthSquared() > cl_predict_lerpthreshold && scale <= 1.00f);
}